

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_psbt.cpp
# Opt level: O3

uint32_t __thiscall
cfd::Psbt::AddTxOutData
          (Psbt *this,Amount *amount,Address *address,Script *redeem_script,
          vector<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_> *key_list)

{
  uint uVar1;
  Script local_70;
  
  cfd::core::Address::GetLockingScript();
  uVar1 = cfd::core::Psbt::AddTxOut((Script *)this,(Amount *)&local_70);
  core::Script::~Script(&local_70);
  cfd::core::Psbt::SetTxOutData((uint)this,(Script *)(ulong)uVar1,(vector *)redeem_script);
  return 0;
}

Assistant:

uint32_t Psbt::AddTxOutData(
    const Amount& amount, const Address& address, const Script& redeem_script,
    const std::vector<KeyData>& key_list) {
  uint32_t index =
      cfd::core::Psbt::AddTxOut(address.GetLockingScript(), amount);
  try {
    SetTxOutData(index, redeem_script, key_list);
  } catch (const CfdException& except) {
    struct wally_psbt* psbt_pointer;
    psbt_pointer = static_cast<struct wally_psbt*>(wally_psbt_pointer_);
    wally_psbt_remove_output(psbt_pointer, index);
    base_tx_ = cfd::core::Psbt::RebuildTransaction(wally_psbt_pointer_);
    throw except;
  }
  return 0;
}